

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TidyConfigParser.cpp
# Opt level: O0

void __thiscall TidyConfigParser::parseCheckConfigs(TidyConfigParser *this)

{
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  byte bVar1;
  char cVar2;
  bool bVar3;
  TidyConfigParser *in_RDI;
  string optionValue_2;
  string optionValue_1;
  string optionValue;
  anon_class_8_1_55d92b42 isRegexOptionValueChar;
  anon_class_1_0_00000001 isOptionValueChar;
  anon_class_1_0_00000001 isRegexMeta;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  optionValues;
  char currentChar;
  string optionName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa70;
  undefined6 in_stack_fffffffffffffa78;
  char in_stack_fffffffffffffa7e;
  char in_stack_fffffffffffffa7f;
  anon_class_8_1_55d92b42 in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  char in_stack_fffffffffffffa8c;
  char in_stack_fffffffffffffa8d;
  char in_stack_fffffffffffffa8e;
  char in_stack_fffffffffffffa8f;
  TidyConfigParser *in_stack_fffffffffffffa90;
  undefined4 in_stack_fffffffffffffab8;
  int in_stack_fffffffffffffabc;
  char *in_stack_fffffffffffffac0;
  TidyConfigParser *in_stack_fffffffffffffac8;
  undefined1 local_530 [32];
  undefined4 in_stack_fffffffffffffaf0;
  undefined4 in_stack_fffffffffffffaf4;
  int iVar4;
  string *in_stack_fffffffffffffaf8;
  TidyConfigParser *in_stack_fffffffffffffb00;
  int local_4ec;
  char *local_4e8;
  undefined8 local_4e0;
  undefined1 local_4d8 [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  int local_474;
  char *local_470;
  undefined8 local_468;
  undefined1 local_460 [32];
  undefined1 *local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438;
  int local_414;
  char *local_410;
  undefined8 local_408;
  undefined1 local_400 [72];
  undefined1 *local_3b8;
  undefined1 local_3aa;
  undefined1 local_3a9 [29];
  int local_38c;
  char *local_388;
  undefined8 local_380;
  undefined1 local_378 [55];
  char local_341 [17];
  format_args in_stack_fffffffffffffcd0;
  TidyConfigParser *pTVar5;
  size_t in_stack_fffffffffffffce8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  undefined8 local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  undefined8 uStack_2e0;
  char *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  undefined8 uStack_2b8;
  undefined1 *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  undefined8 local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_280;
  char *local_278;
  undefined8 uStack_270;
  char *local_260;
  int *local_258;
  char *local_250;
  undefined8 uStack_248;
  undefined1 *local_240;
  int local_238 [4];
  char local_228 [16];
  undefined8 local_218;
  int *local_210;
  char *local_208;
  undefined8 uStack_200;
  char *local_1f0;
  int *local_1e8;
  char *local_1e0;
  undefined8 uStack_1d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0;
  char local_1b8 [16];
  undefined8 local_1a8;
  char *local_1a0;
  char *local_198;
  undefined8 uStack_190;
  char *local_180;
  int *local_178;
  char *local_170;
  undefined8 uStack_168;
  undefined1 *local_160;
  int local_158 [4];
  char local_148 [16];
  pointer local_138;
  int *local_130;
  char *local_128;
  undefined8 uStack_120;
  char *local_118;
  int *local_110;
  char *local_108;
  undefined8 uStack_100;
  undefined1 *local_f8;
  int local_ec;
  int *local_e8;
  int local_dc;
  char *local_d8;
  int local_cc;
  int *local_c8;
  int local_bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_b8;
  int local_ac;
  undefined1 *local_a8;
  char local_99;
  int *local_98;
  char local_89;
  char *local_88;
  char local_79;
  char *local_78;
  char local_69;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_68;
  char local_59;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  int *local_50;
  pointer *local_48;
  char *local_40;
  undefined8 *local_38;
  int *local_30;
  undefined8 *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  pTVar5 = in_RDI;
  do {
    bVar1 = std::ios::eof();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      return;
    }
    cVar2 = peekChar((TidyConfigParser *)
                     CONCAT17(in_stack_fffffffffffffa7f,
                              CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
    if (cVar2 == '\n') {
      nextChar((TidyConfigParser *)
               CONCAT17(in_stack_fffffffffffffa7f,
                        CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
    }
    std::__cxx11::string::string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffa80.isRegexMeta);
    cVar2 = readIf<int_(*)(int)_noexcept,_true>
                      (in_stack_fffffffffffffa90,
                       (string *)
                       CONCAT17(in_stack_fffffffffffffa8f,
                                CONCAT16(in_stack_fffffffffffffa8e,
                                         CONCAT15(in_stack_fffffffffffffa8d,
                                                  CONCAT14(in_stack_fffffffffffffa8c,
                                                           in_stack_fffffffffffffa88)))),
                       (_func_int_int *)in_stack_fffffffffffffa80.isRegexMeta);
    if (cVar2 != ':') {
      local_388 = "Expected \':\' or a letter but found ({}){}";
      local_380 = 0x29;
      local_38c = (int)cVar2;
      local_f8 = local_378;
      local_108 = "Expected \':\' or a letter but found ({}){}";
      uStack_100 = 0x29;
      local_110 = &local_38c;
      local_118 = local_341;
      local_128 = "Expected \':\' or a letter but found ({}){}";
      uStack_120 = 0x29;
      local_e8 = local_158;
      local_98 = local_158 + 4;
      local_99 = local_341[0];
      local_48 = &local_138;
      local_138 = (pointer)0x81;
      fmt.size_ = in_stack_fffffffffffffce8;
      fmt.data_ = (char *)pTVar5;
      local_341[0] = cVar2;
      local_ec = local_38c;
      local_50 = local_e8;
      local_158[0] = local_38c;
      local_148[0] = local_99;
      local_130 = local_e8;
      ::fmt::v11::vformat_abi_cxx11_(fmt,in_stack_fffffffffffffcd0);
      reportErrorAndExit(in_stack_fffffffffffffac8,(string *)in_stack_fffffffffffffac0);
      std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      cVar2 = local_341[0];
    }
    local_341[0] = cVar2;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x1c6f9f);
    local_3a9[0] = 0;
    local_3aa = 0;
    local_3b8 = local_3a9;
    cVar2 = peekChar((TidyConfigParser *)
                     CONCAT17(in_stack_fffffffffffffa7f,
                              CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
    if (cVar2 == '[') {
      local_341[0] = nextChar((TidyConfigParser *)
                              CONCAT17(in_stack_fffffffffffffa7f,
                                       CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)
                                      ));
      do {
        in_stack_fffffffffffffa90 = (TidyConfigParser *)(local_400 + 0x28);
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa80.isRegexMeta);
        local_341[0] = readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:292:34),_true>
                                 (in_RDI,in_stack_fffffffffffffa90);
        bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c7039)
        ;
        if (!bVar3) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffa80.isRegexMeta,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa7f,
                              CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
        }
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      } while (local_341[0] == ',');
      if (local_341[0] != ']') {
        local_410 = "Expected \']\' but found ({}){}";
        local_408 = 0x1d;
        local_414 = (int)local_341[0];
        local_160 = local_400;
        local_170 = "Expected \']\' but found ({}){}";
        uStack_168 = 0x1d;
        local_178 = &local_414;
        local_180 = local_341;
        local_198 = "Expected \']\' but found ({}){}";
        uStack_190 = 0x1d;
        local_d8 = local_1d0._M_local_buf + 8;
        local_88 = local_1b8;
        local_89 = local_341[0];
        local_38 = &local_1a8;
        local_1a8 = 0x81;
        fmt_00.size_ = in_stack_fffffffffffffce8;
        fmt_00.data_ = (char *)pTVar5;
        local_dc = local_414;
        local_40 = local_d8;
        local_1d0._8_4_ = local_414;
        local_1b8[0] = local_89;
        local_1a0 = local_d8;
        ::fmt::v11::vformat_abi_cxx11_(fmt_00,in_stack_fffffffffffffcd0);
        reportErrorAndExit(in_stack_fffffffffffffac8,(string *)in_stack_fffffffffffffac0);
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      }
      in_stack_fffffffffffffa8f =
           nextChar((TidyConfigParser *)
                    CONCAT17(in_stack_fffffffffffffa7f,
                             CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
      local_341[0] = in_stack_fffffffffffffa8f;
    }
    else {
      in_stack_fffffffffffffa8e =
           peekChar((TidyConfigParser *)
                    CONCAT17(in_stack_fffffffffffffa7f,
                             CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
      if (in_stack_fffffffffffffa8e == '\"') {
        in_stack_fffffffffffffa8d =
             nextChar((TidyConfigParser *)
                      CONCAT17(in_stack_fffffffffffffa7f,
                               CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
        in_stack_fffffffffffffa80.isRegexMeta = (anon_class_1_0_00000001 *)&local_438;
        local_341[0] = in_stack_fffffffffffffa8d;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa80.isRegexMeta);
        local_440 = local_3b8;
        in_stack_fffffffffffffa8c =
             readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:293:39),_true>
                       ((TidyConfigParser *)
                        CONCAT17(in_stack_fffffffffffffa7f,
                                 CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)),
                        in_stack_fffffffffffffa70,in_stack_fffffffffffffa80);
        local_341[0] = in_stack_fffffffffffffa8c;
        bVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1c7309)
        ;
        if (!bVar3) {
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string&>
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffffa80.isRegexMeta,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(in_stack_fffffffffffffa7f,
                              CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
        }
        if (local_341[0] != '\"') {
          local_470 = "Expected \'\"\' but found ({}){}";
          local_468 = 0x1d;
          local_474 = (int)local_341[0];
          local_1d0._M_allocated_capacity = (size_type)local_460;
          local_1e0 = "Expected \'\"\' but found ({}){}";
          uStack_1d8 = 0x1d;
          local_1e8 = &local_474;
          local_1f0 = local_341;
          local_208 = "Expected \'\"\' but found ({}){}";
          uStack_200 = 0x1d;
          local_c8 = local_238;
          local_78 = local_228;
          local_79 = local_341[0];
          local_28 = &local_218;
          local_218 = 0x81;
          fmt_01.size_ = in_stack_fffffffffffffce8;
          fmt_01.data_ = (char *)pTVar5;
          local_cc = local_474;
          local_30 = local_c8;
          local_238[0] = local_474;
          local_228[0] = local_79;
          local_210 = local_c8;
          ::fmt::v11::vformat_abi_cxx11_(fmt_01,in_stack_fffffffffffffcd0);
          reportErrorAndExit(in_stack_fffffffffffffac8,(string *)in_stack_fffffffffffffac0);
          std::__cxx11::string::~string(in_stack_fffffffffffffa70);
        }
        in_stack_fffffffffffffa7f =
             nextChar((TidyConfigParser *)
                      CONCAT17(in_stack_fffffffffffffa7f,
                               CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
        local_341[0] = in_stack_fffffffffffffa7f;
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      }
      else {
        in_stack_fffffffffffffa70 = &local_498;
        std::__cxx11::string::string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffa80.isRegexMeta);
        in_stack_fffffffffffffa7e =
             readIf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_MikePopoloski[P]slang_tools_tidy_src_TidyConfigParser_cpp:292:34),_true>
                       (in_RDI,in_stack_fffffffffffffa70);
        local_341[0] = in_stack_fffffffffffffa7e;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)in_stack_fffffffffffffa80.isRegexMeta,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffa7f,
                            CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      }
    }
    if (local_341[0] == ',') {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffac0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      setCheckConfig(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa80.isRegexMeta);
      cVar2 = nextChar((TidyConfigParser *)
                       CONCAT17(in_stack_fffffffffffffa7f,
                                CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
      if (cVar2 != '\n') {
        local_4e8 = "Expected new line but found: ({}){}";
        local_4e0 = 0x23;
        local_4ec = (int)local_341[0];
        local_240 = local_4d8;
        local_250 = "Expected new line but found: ({}){}";
        uStack_248 = 0x23;
        local_258 = &local_4ec;
        local_260 = local_341;
        local_278 = "Expected new line but found: ({}){}";
        uStack_270 = 0x23;
        local_b8 = &local_2a8;
        local_68 = &local_2a8.field_2;
        local_69 = local_341[0];
        local_18 = &local_288;
        local_288 = 0x81;
        fmt_02.size_ = in_stack_fffffffffffffce8;
        fmt_02.data_ = (char *)pTVar5;
        local_bc = local_4ec;
        local_20 = local_b8;
        local_2a8._M_dataplus._M_p._0_4_ = local_4ec;
        local_2a8.field_2._M_local_buf[0] = local_69;
        local_280 = local_b8;
        ::fmt::v11::vformat_abi_cxx11_(fmt_02,in_stack_fffffffffffffcd0);
        reportErrorAndExit(in_stack_fffffffffffffac8,(string *)in_stack_fffffffffffffac0);
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
      }
LAB_001c7a0e:
      iVar4 = 0;
    }
    else {
      if ((local_341[0] != '\n') && (local_341[0] != '\0')) {
        in_stack_fffffffffffffac0 = "Expected \',\' new line or a letter but found ({}){}";
        in_stack_fffffffffffffac8 = (TidyConfigParser *)0x32;
        in_stack_fffffffffffffabc = (int)local_341[0];
        local_2b0 = local_530;
        local_2c0 = "Expected \',\' new line or a letter but found ({}){}";
        uStack_2b8 = 0x32;
        local_2c8 = &stack0xfffffffffffffabc;
        local_2d0 = local_341;
        local_2e8 = "Expected \',\' new line or a letter but found ({}){}";
        uStack_2e0 = 0x32;
        local_a8 = &stack0xfffffffffffffce8;
        local_58 = &local_308;
        local_59 = local_341[0];
        local_8 = &local_2f8;
        local_2f8 = 0x81;
        fmt_03.size_ = in_stack_fffffffffffffce8;
        fmt_03.data_ = (char *)pTVar5;
        local_ac = in_stack_fffffffffffffabc;
        local_10 = local_a8;
        local_308._M_local_buf[0] = local_59;
        local_2f0 = local_a8;
        ::fmt::v11::vformat_abi_cxx11_(fmt_03,in_stack_fffffffffffffcd0);
        reportErrorAndExit(in_stack_fffffffffffffac8,(string *)in_stack_fffffffffffffac0);
        std::__cxx11::string::~string(in_stack_fffffffffffffa70);
        goto LAB_001c7a0e;
      }
      while (cVar2 = peekChar((TidyConfigParser *)
                              CONCAT17(in_stack_fffffffffffffa7f,
                                       CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)
                                      )), cVar2 == '\n') {
        nextChar((TidyConfigParser *)
                 CONCAT17(in_stack_fffffffffffffa7f,
                          CONCAT16(in_stack_fffffffffffffa7e,in_stack_fffffffffffffa78)));
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffffac0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffabc,in_stack_fffffffffffffab8));
      setCheckConfig(in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffaf4,in_stack_fffffffffffffaf0));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffa80.isRegexMeta);
      in_RDI->parserState = Initial;
      iVar4 = 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa80.isRegexMeta);
    std::__cxx11::string::~string(in_stack_fffffffffffffa70);
    if (iVar4 != 0) {
      return;
    }
    in_stack_fffffffffffffaf4 = 0;
  } while( true );
}

Assistant:

void TidyConfigParser::parseCheckConfigs() {
    while (!fileStream.eof()) {
        // Parse optional newline
        if (peekChar() == '\n')
            nextChar();

        // Parse option name
        std::string optionName;
        char currentChar = readIf(optionName, isalpha);

        if (currentChar != ':') {
            reportErrorAndExit(fmt::format("Expected ':' or a letter but found ({}){}",
                                           +currentChar, currentChar));
        }

        // Parse multiple option values
        std::vector<std::string> optionValues;

        auto isRegexMeta = [](char c) {
            return c == '.' || c == '^' || c == '$' || c == '*' || c == '+' || c == '?' ||
                   c == '{' || c == '}' || c == '[' || c == ']' || c == '\\' || c == '|' ||
                   c == '(' || c == ')';
        };

        auto isOptionValueChar = [](char c) { return isalnum(c) || c == '_'; };
        auto isRegexOptionValueChar = [&](char c) {
            return isalnum(c) || isRegexMeta(c) || c == '_';
        };

        if (peekChar() == '[') {
            currentChar = nextChar(); // skip '['

            do {
                std::string optionValue;
                currentChar = readIf(optionValue, isOptionValueChar);
                if (!optionValue.empty())
                    optionValues.emplace_back(optionValue);
            } while (currentChar == ',');

            if (currentChar != ']') {
                reportErrorAndExit(
                    fmt::format("Expected ']' but found ({}){}", +currentChar, currentChar));
            }
            currentChar = nextChar();
        }
        else if (peekChar() == '"') {
            currentChar = nextChar(); // skip '"'

            std::string optionValue;
            currentChar = readIf(optionValue, isRegexOptionValueChar);
            if (!optionValue.empty())
                optionValues.emplace_back((optionValue));

            if (currentChar != '"') {
                reportErrorAndExit(
                    fmt::format("Expected '\"' but found ({}){}", +currentChar, currentChar));
            }
            currentChar = nextChar();
        }
        else { // Parse single option value
            std::string optionValue;
            currentChar = readIf(optionValue, isOptionValueChar);
            optionValues.emplace_back(optionValue);
        }

        if (currentChar == ',') {
            setCheckConfig(optionName, optionValues);
            if (nextChar() != '\n') {
                reportErrorAndExit(
                    fmt::format("Expected new line but found: ({}){}", +currentChar, currentChar));
            }
        }
        else if (currentChar == '\n' || currentChar == 0) {
            while (peekChar() == '\n')
                nextChar();
            setCheckConfig(optionName, optionValues);
            parserState = ParserState::Initial;
            return;
        }
        else {
            reportErrorAndExit(fmt::format("Expected ',' new line or a letter but found ({}){}",
                                           +currentChar, currentChar));
        }
    }
}